

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.c
# Opt level: O1

error eval_expr(atom expr,atom env,atom *result)

{
  uint uVar1;
  type *ptVar2;
  long lVar3;
  uint *puVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  anon_union_8_9_1d3277aa_for_value aVar7;
  bool bVar8;
  int saved_size;
  char *pcVar9;
  error eVar10;
  anon_union_8_9_1d3277aa_for_value aVar11;
  type tVar12;
  char **ppcVar13;
  int iVar14;
  type tVar15;
  atom env_00;
  atom env_01;
  atom env_02;
  atom env_03;
  atom env_04;
  atom cdr_val;
  atom arg_names;
  atom args_00;
  atom args_01;
  atom v;
  atom a;
  atom expr_00;
  atom expr_01;
  atom expr_02;
  atom expr_03;
  atom expr_04;
  atom car_val;
  atom env_05;
  atom fn_00;
  atom env_06;
  atom env_07;
  atom env_08;
  atom env_09;
  atom item;
  atom a_00;
  atom a_01;
  atom aVar16;
  atom body;
  atom body_00;
  atom value;
  atom args;
  atom fn;
  atom r;
  vector vargs;
  error local_12c;
  type local_124;
  anon_union_8_9_1d3277aa_for_value local_120;
  char *local_118;
  type *ptStack_110;
  anon_union_8_9_1d3277aa_for_value local_100;
  atom *local_f8;
  atom local_f0;
  anon_union_8_9_1d3277aa_for_value local_e0;
  atom local_d8;
  undefined1 local_c8 [8];
  atom aaStack_c0 [8];
  size_t local_40;
  size_t local_38;
  
  saved_size = (int)stack_size;
  local_120 = expr.value;
  aVar11 = env.value;
  tVar12 = env.type;
  tVar15 = expr.type;
  local_f8 = result;
  do {
    local_100.number = local_120.number;
    aVar16._4_4_ = 0;
    aVar16.type = tVar15;
    aVar16.value.number = local_120.number;
    stack_add(aVar16);
    a._0_8_ = CONCAT44(0,tVar12);
    a.value.number = aVar11.number;
    stack_add(a);
    if (alloc_count_old * 2 < alloc_count) {
      gc();
    }
    if (tVar15 != T_CONS) {
      if (tVar15 == T_SYM) {
        env_09.value.number = aVar11.number;
        env_09._0_8_ = a._0_8_;
        eVar10 = env_get(env_09,local_120.symbol,result);
        err_expr.type = T_SYM;
        err_expr._4_4_ = local_124;
        err_expr.value = local_120;
        return eVar10;
      }
      result->type = tVar15;
      *(type *)&result->field_0x4 = local_124;
      result->value = local_100;
      return ERROR_OK;
    }
    tVar15 = ((local_120.pair)->car).type;
    expr_00._4_4_ = 0;
    expr_00.type = tVar15;
    local_e0 = (anon_union_8_9_1d3277aa_for_value)(local_120.fp)->_IO_read_ptr;
    local_118 = (char *)(*local_120.jb)[0].__jmpbuf[2];
    ptStack_110 = (type *)(local_120.fp)->_IO_read_base;
    pcVar9 = local_118;
    if (tVar15 == T_SYM) {
      if (local_e0.pair == sym_if.value.pair) {
        tVar15 = T_CONS;
        ppcVar13 = &local_118;
        do {
          result = local_f8;
          if (*(uint *)ppcVar13 == 0) {
            local_f8->type = T_NIL;
            *(undefined4 *)&local_f8->field_0x4 = 0;
            local_f8->value = (anon_union_8_9_1d3277aa_for_value)0x0;
            local_12c = ERROR_OK;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = local_f8->value;
            stack_restore_add(saved_size,(atom)(auVar6 << 0x40));
            iVar14 = 1;
            break;
          }
          ptVar2 = (type *)ppcVar13[1];
          expr_03._4_4_ = 0;
          expr_03.type = *ptVar2;
          if (ptVar2[4] == T_NIL) {
            local_124 = ptVar2[1];
            local_120 = (anon_union_8_9_1d3277aa_for_value)
                        ((anon_union_8_9_1d3277aa_for_value *)(ptVar2 + 2))->fp;
            iVar14 = 2;
            bVar8 = false;
            tVar15 = *ptVar2;
          }
          else {
            env_03._4_4_ = 0;
            env_03.type = tVar12;
            env_03.value.number = aVar11.number;
            expr_03.value.pair = ((anon_union_8_9_1d3277aa_for_value *)(ptVar2 + 2))->pair;
            eVar10 = eval_expr(expr_03,env_03,(atom *)local_c8);
            if (eVar10 == ERROR_OK) {
              ptVar2 = *(type **)(ppcVar13[1] + 0x18);
              if (local_c8._0_4_ == T_NIL) {
                ppcVar13 = (char **)(ptVar2 + 4);
                iVar14 = 0;
                bVar8 = true;
              }
              else {
                local_124 = ptVar2[1];
                local_120 = (anon_union_8_9_1d3277aa_for_value)
                            ((anon_union_8_9_1d3277aa_for_value *)(ptVar2 + 2))->fp;
                iVar14 = 2;
                bVar8 = false;
                tVar15 = *ptVar2;
              }
            }
            else {
              stack_restore(saved_size);
              iVar14 = 1;
              bVar8 = false;
              local_12c = eVar10;
            }
          }
          result = local_f8;
        } while (bVar8);
      }
      else {
        if (local_e0.pair == sym_assign.value.pair) {
          if (((int)local_118 == 0) || (ptStack_110[4] == T_NIL)) goto LAB_00105ac5;
          if (*ptStack_110 == T_SYM) {
            pcVar5 = *(char **)(ptStack_110 + 2);
            expr_04._0_8_ = CONCAT44(0,**(uint **)(ptStack_110 + 6));
            env_04._4_4_ = 0;
            env_04.type = tVar12;
            env_04.value.number = aVar11.number;
            expr_04.value.pair =
                 ((anon_union_8_9_1d3277aa_for_value *)(*(uint **)(ptStack_110 + 6) + 2))->pair;
            local_118 = pcVar9;
            local_12c = eval_expr(expr_04,env_04,(atom *)local_c8);
            if (local_12c == ERROR_OK) {
              *(undefined1 (*) [8])result = local_c8;
              (result->value).pair = (pair *)aaStack_c0[0]._0_8_;
              value._0_8_ = (ulong)local_c8 & 0xffffffff;
              env_08.value.number = aVar11.number;
              env_08._0_8_ = expr_04._0_8_;
              value.value = (anon_union_8_9_1d3277aa_for_value)aaStack_c0[0]._0_8_;
              env_assign_eq(env_08,pcVar5,value);
              goto LAB_00105b53;
            }
LAB_001058ab:
            stack_restore(saved_size);
          }
          else {
LAB_00105af4:
            local_118 = pcVar9;
            stack_restore(saved_size);
            local_12c = ERROR_TYPE;
          }
        }
        else if (local_e0.pair == sym_quote.value.pair) {
          if (((int)local_118 == 0) || (ptStack_110[4] != T_NIL)) goto LAB_00105ac5;
          tVar15 = ptStack_110[1];
          aVar7 = *(anon_union_8_9_1d3277aa_for_value *)(ptStack_110 + 2);
          result->type = ptStack_110[0];
          *(type *)&result->field_0x4 = tVar15;
          result->value = aVar7;
          local_118 = pcVar9;
LAB_00105b53:
          a_01._4_4_ = 0;
          a_01.type = result->type;
          a_01.value.pair = (result->value).pair;
          stack_restore_add(saved_size,a_01);
          local_12c = ERROR_OK;
        }
        else if (local_e0.pair == sym_fn.value.pair) {
          if ((int)local_118 == 0) goto LAB_00105ac5;
          args_00._4_4_ = 0;
          args_00.type = *ptStack_110;
          body._4_4_ = 0;
          body.type = ptStack_110[4];
          env_06._4_4_ = 0;
          env_06.type = tVar12;
          args_00.value.pair = ((anon_union_8_9_1d3277aa_for_value *)(ptStack_110 + 2))->pair;
          env_06.value.number = aVar11.number;
          body.value.pair = ((anon_union_8_9_1d3277aa_for_value *)(ptStack_110 + 6))->pair;
          local_118 = pcVar9;
          local_12c = make_closure(env_06,args_00,body,result);
LAB_00105a0a:
          a_00._4_4_ = 0;
          a_00.type = result->type;
          a_00.value.pair = (result->value).pair;
          stack_restore_add(saved_size,a_00);
        }
        else if (local_e0.pair == sym_do.value.pair) {
          while( true ) {
            local_118 = pcVar9;
            ptVar2 = ptStack_110;
            iVar14 = 1;
            if ((int)local_118 == 0) break;
            tVar15 = *ptStack_110;
            if (ptStack_110[4] == T_NIL) {
              local_124 = ptStack_110[1];
              local_120 = (anon_union_8_9_1d3277aa_for_value)
                          ((anon_union_8_9_1d3277aa_for_value *)(ptStack_110 + 2))->fp;
LAB_00105b23:
              stack_restore(saved_size);
              iVar14 = 2;
              goto LAB_00105ae1;
            }
            expr_01._4_4_ = 0;
            expr_01.type = tVar15;
            env_01._4_4_ = 0;
            env_01.type = tVar12;
            env_01.value.number = aVar11.number;
            expr_01.value.pair = ((anon_union_8_9_1d3277aa_for_value *)(ptStack_110 + 2))->pair;
            eVar10 = eval_expr(expr_01,env_01,result);
            if (eVar10 != ERROR_OK) {
              tVar15 = T_CONS;
              local_12c = eVar10;
              goto LAB_00105ae1;
            }
            ptStack_110 = *(type **)(ptVar2 + 6);
            pcVar9 = *(char **)(ptVar2 + 4);
          }
          local_12c = ERROR_OK;
        }
        else {
          if (local_e0.pair != sym_mac.value.pair) goto LAB_00105676;
          if (((int)local_118 != 0) && (ptStack_110[4] != T_NIL)) {
            puVar4 = *(uint **)(ptStack_110 + 6);
            body_00._4_4_ = 0;
            body_00.type = puVar4[4];
            if (puVar4[4] != 0) {
              if (*ptStack_110 != T_SYM) goto LAB_00105af4;
              tVar15 = ptStack_110[1];
              pcVar5 = *(char **)(ptStack_110 + 2);
              args_01._4_4_ = 0;
              args_01.type = *puVar4;
              env_07._4_4_ = 0;
              env_07.type = tVar12;
              args_01.value.pair = ((anon_union_8_9_1d3277aa_for_value *)(puVar4 + 2))->pair;
              env_07.value.number = aVar11.number;
              body_00.value.pair = ((anon_union_8_9_1d3277aa_for_value *)(puVar4 + 6))->pair;
              local_118 = pcVar9;
              local_12c = make_closure(env_07,args_01,body_00,(atom *)local_c8);
              if (local_12c != ERROR_OK) goto LAB_001058ab;
              local_c8._0_4_ = 6;
              result->type = T_SYM;
              *(type *)&result->field_0x4 = tVar15;
              (result->value).symbol = pcVar5;
              v.value.pair = (pair *)aaStack_c0[0]._0_8_;
              v._0_8_ = 6;
              table_set_sym((table *)(aVar11.fp)->_IO_read_base,pcVar5,v);
              goto LAB_00105b53;
            }
          }
LAB_00105ac5:
          local_118 = pcVar9;
          stack_restore(saved_size);
          local_12c = ERROR_ARGS;
        }
LAB_00105adb:
        iVar14 = 1;
        tVar15 = T_CONS;
      }
    }
    else {
LAB_00105676:
      env_00._4_4_ = 0;
      env_00.type = tVar12;
      env_00.value.number = aVar11.number;
      expr_00.value.pair = local_e0.pair;
      local_118 = pcVar9;
      eVar10 = eval_expr(expr_00,env_00,&local_f0);
      if (eVar10 == ERROR_OK) {
        local_40 = 8;
        local_38 = 0;
        local_c8 = (undefined1  [8])aaStack_c0;
        ppcVar13 = &local_118;
        do {
          if (*(int *)ppcVar13 == 0) {
            fn_00._4_4_ = 0;
            fn_00.type = local_f0.type;
            if (local_f0.type != T_CLOSURE) {
              fn_00.value.number = local_f0.value.number;
              local_12c = apply(fn_00,(vector *)local_c8,result);
              if (local_c8 != (undefined1  [8])aaStack_c0) {
                free((void *)local_c8);
              }
              goto LAB_00105a0a;
            }
            uVar1 = *(uint *)(local_f0.value.fp)->_IO_read_base;
            local_100 = (anon_union_8_9_1d3277aa_for_value)
                        ((anon_union_8_9_1d3277aa_for_value *)
                        ((long)(local_f0.value.fp)->_IO_read_base + 8))->pair;
            tVar15 = ((local_f0.value.pair)->car).type;
            aVar11 = (anon_union_8_9_1d3277aa_for_value)(local_f0.value.fp)->_IO_read_ptr;
            aVar16 = make_table(4);
            car_val._4_4_ = 0;
            car_val.type = tVar15;
            cdr_val.value.number = aVar16.value.number;
            cdr_val._0_8_ = 0xb;
            car_val.value =
                 (anon_union_8_9_1d3277aa_for_value)(anon_union_8_9_1d3277aa_for_value)aVar11.pair;
            aVar16 = cons(car_val,cdr_val);
            aVar11 = aVar16.value;
            lVar3 = (*local_f0.value.jb)[0].__jmpbuf[3];
            tVar15 = *(type *)(lVar3 + 0x10);
            local_124 = *(type *)(lVar3 + 0x14);
            local_120 = (anon_union_8_9_1d3277aa_for_value)
                        ((anon_union_8_9_1d3277aa_for_value *)(lVar3 + 0x18))->fp;
            tVar12 = T_CONS;
            arg_names._4_4_ = 0;
            arg_names.type = uVar1;
            arg_names.value.number = local_100.number;
            env_05.value.number = aVar11.number;
            env_05._0_8_ = 1;
            eVar10 = env_bind(env_05,arg_names,(vector *)local_c8);
            if (eVar10 == ERROR_OK) {
              if (local_c8 != (undefined1  [8])aaStack_c0) {
                free((void *)local_c8);
              }
              goto LAB_00105b23;
            }
            iVar14 = 1;
            local_12c = eVar10;
            goto LAB_00105ae1;
          }
          expr_02._4_4_ = 0;
          expr_02.type = *(uint *)ppcVar13[1];
          env_02._4_4_ = 0;
          env_02.type = tVar12;
          env_02.value.number = aVar11.number;
          expr_02.value.pair = ((anon_union_8_9_1d3277aa_for_value *)((long)ppcVar13[1] + 8))->pair;
          eVar10 = eval_expr(expr_02,env_02,&local_d8);
          if (eVar10 == ERROR_OK) {
            item._4_4_ = 0;
            item.type = local_d8.type;
            item.value.number = local_d8.value.number;
            vector_add((vector *)local_c8,item);
            ppcVar13 = (char **)(ppcVar13[1] + 0x10);
          }
          else {
            if (local_c8 != (undefined1  [8])aaStack_c0) {
              free((void *)local_c8);
            }
            stack_restore(saved_size);
            local_12c = eVar10;
          }
        } while (eVar10 == ERROR_OK);
        goto LAB_00105adb;
      }
      stack_restore(saved_size);
      iVar14 = 1;
      tVar15 = T_CONS;
      local_12c = eVar10;
    }
LAB_00105ae1:
    if (iVar14 != 2) {
      return local_12c;
    }
  } while( true );
}

Assistant:

error eval_expr(atom expr, atom env, atom *result)
{
	error err;
	int ss = stack_size; /* save stack point */
start_eval:
	stack_add(expr);
	stack_add(env);
	consider_gc();
	if (expr.type == T_SYM) {
		err = env_get(env, expr.value.symbol, result);
		err_expr = expr;
		return err;
	}
	else if (expr.type != T_CONS) {
		*result = expr;
		return ERROR_OK;
	}
	else {
		atom op = car(expr);
		atom args = cdr(expr);

		if (op.type == T_SYM) {
			/* Handle special forms */
			if (op.value.symbol == sym_if.value.symbol) {
				atom *p = &args;
				while (!no(*p)) {
					atom cond;
					if (no(cdr(*p))) { /* else */
						/* tail call optimization of else part */
						expr = car(*p);
						goto start_eval;
					}
					err = eval_expr(car(*p), env, &cond);
					if (err) {
						stack_restore(ss);
						return err;
					}
					if (!no(cond)) { /* then */
						/* tail call optimization of err = eval_expr(car(cdr(*p)), env, result); */
						expr = car(cdr(*p));
						goto start_eval;
					}
					p = &cdr(cdr(*p));
				}
				*result = nil;
				stack_restore_add(ss, *result);
				return ERROR_OK;
			}
			else if (op.value.symbol == sym_assign.value.symbol) {
				atom sym;
				if (no(args) || no(cdr(args))) {
					stack_restore(ss);
					return ERROR_ARGS;
				}

				sym = car(args);
				if (sym.type == T_SYM) {
					atom val;
					err = eval_expr(car(cdr(args)), env, &val);
					if (err) {
						stack_restore(ss);
						return err;
					}

					*result = val;
					err = env_assign_eq(env, sym.value.symbol, val);
					stack_restore_add(ss, *result);
					return err;
				}
				else {
					stack_restore(ss);
					return ERROR_TYPE;
				}
			}
			else if (op.value.symbol == sym_quote.value.symbol) {
				if (no(args) || !no(cdr(args))) {
					stack_restore(ss);
					return ERROR_ARGS;
				}

				*result = car(args);
				stack_restore_add(ss, *result);
				return ERROR_OK;
			}
			else if (op.value.symbol == sym_fn.value.symbol) {
				if (no(args)) {
					stack_restore(ss);
					return ERROR_ARGS;
				}
				err = make_closure(env, car(args), cdr(args), result);
				stack_restore_add(ss, *result);
				return err;
			}
			else if (op.value.symbol == sym_do.value.symbol) {
				/* Evaluate the body */
				while (!no(args)) {
					if (no(cdr(args))) {
						/* tail call */
						expr = car(args);
						stack_restore(ss);
						goto start_eval;
					}
					error err = eval_expr(car(args), env, result);
					if (err) {
						return err;
					}
					args = cdr(args);
				}
				return ERROR_OK;
			}
			else if (op.value.symbol == sym_mac.value.symbol) { /* (mac name (arg ...) body) */
				atom name, macro;

				if (no(args) || no(cdr(args)) || no(cdr(cdr(args)))) {
					stack_restore(ss);
					return ERROR_ARGS;
				}

				name = car(args);
				if (name.type != T_SYM) {
					stack_restore(ss);
					return ERROR_TYPE;
				}

				err = make_closure(env, car(cdr(args)), cdr(cdr(args)), &macro);
				if (!err) {
					macro.type = T_MACRO;
					*result = name;
					err = env_assign(env, name.value.symbol, macro);
					stack_restore_add(ss, *result);
					return err;
				}
				else {
					stack_restore(ss);
					return err;
				}
			}
		}

		/* Evaluate operator */
		atom fn;
		err = eval_expr(op, env, &fn);
		if (err) {
			stack_restore(ss);
			return err;
		}

		/* Evaulate arguments */
		struct vector vargs;
		vector_new(&vargs);
		atom *p = &args;
		while (!no(*p)) {
			atom r;
			err = eval_expr(car(*p), env, &r);
			if (err) {
				vector_free(&vargs);
				stack_restore(ss);
				return err;
			}
			vector_add(&vargs, r);
			p = &cdr(*p);
		}

		/* tail call optimization of err = apply(fn, args, result); */
		if (fn.type == T_CLOSURE) {
			atom arg_names = car(cdr(fn));
			env = env_create(car(fn));
			expr = cdr(cdr(fn));

			/* Bind the arguments */
			err = env_bind(env, arg_names, &vargs);
			if (err) {
				return err;
			}
			vector_free(&vargs);
			stack_restore(ss);
			goto start_eval;
		}
		else {
			err = apply(fn, &vargs, result);
			vector_free(&vargs);
		}
		stack_restore_add(ss, *result);
		return err;
	}
}